

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O3

int get_valid_genders(nh_roles_info *ri,int rolenum,int racenum,int alignnum,nh_listitem *list,
                     int listlen)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = ri->num_genders;
  if (iVar4 < 1) {
    iVar3 = 0;
  }
  else {
    lVar2 = 0;
    iVar3 = 0;
    do {
      iVar1 = is_valid_character(ri,rolenum,racenum,(int)lVar2,alignnum);
      if (iVar1 != 0) {
        if (iVar3 < listlen && list != (nh_listitem *)0x0) {
          strcpy(list[iVar3].caption,ri->gendnames[lVar2]);
          list[iVar3].id = (int)lVar2;
          iVar4 = ri->num_genders;
        }
        iVar3 = iVar3 + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar4);
  }
  return iVar3;
}

Assistant:

static int get_valid_genders(const struct nh_roles_info *ri, int rolenum,
			   int racenum, int alignnum, struct nh_listitem *list, int listlen)
{
    int i;
    int count = 0;
    
    for (i = 0; i < ri->num_genders; i++) {
	if (!is_valid_character(ri, rolenum, racenum, i, alignnum))
	    continue;
	
	if (list && count < listlen) {
	    strcpy(list[count].caption, ri->gendnames[i]);
	    list[count].id = i;
	}
	count++;
    }
    return count;
}